

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O1

bool __thiscall cmCTestUploadCommand::CheckArgumentKeyword(cmCTestUploadCommand *this,string *arg)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)arg);
  if (iVar1 == 0) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 3;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 == 0) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
      (this->super_cmCTestHandlerCommand).Quiet = true;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)arg);
      if (iVar1 != 0) {
        return false;
      }
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 4;
    }
  }
  return true;
}

Assistant:

bool cmCTestUploadCommand::CheckArgumentKeyword(std::string const& arg)
{
  if (arg == "FILES") {
    this->ArgumentDoing = ArgumentDoingFiles;
    return true;
  }
  if (arg == "QUIET") {
    this->ArgumentDoing = ArgumentDoingNone;
    this->Quiet = true;
    return true;
  }
  if (arg == "CAPTURE_CMAKE_ERROR") {
    this->ArgumentDoing = ArgumentDoingCaptureCMakeError;
    return true;
  }
  return false;
}